

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O1

void __thiscall
xLearn::Loss::CalcGradDist
          (Loss *this,DMatrix *matrix,Model *model,vector<float,_std::allocator<float>_> *grad)

{
  index_t iVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> feature_list;
  DMatrix mini_batch;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  undefined1 local_98 [88];
  unkbyte9 Stack_40;
  index_t local_34;
  
  do {
    local_34 = 0;
    local_98._0_8_ = 0;
    local_98._8_8_ = 0;
    local_98._16_4_ = 0;
    local_98._24_9_ = SUB649(ZEXT464(0),0) << 0x40;
    Stack_40._0_8_ = (pointer)0x0;
    Stack_40._8_1_ = false;
    local_98._33_55_ = SUB6455(ZEXT464(0),1);
    DMatrix::ReAlloc((DMatrix *)local_98,(ulong)this->batch_size_,true);
    iVar1 = DMatrix::GetMiniBatch(matrix,this->batch_size_,(DMatrix *)local_98);
    if (iVar1 == 0) {
      DMatrix::~DMatrix((DMatrix *)local_98);
      return;
    }
    local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98._16_4_ = iVar1;
    DMatrix::Compress((DMatrix *)local_98,&local_b8);
    if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    DMatrix::~DMatrix((DMatrix *)local_98);
  } while (iVar1 != 0);
  return;
}

Assistant:

void Loss::CalcGradDist(DMatrix* matrix,
                        Model& model,
                        std::vector<real_t>& grad) {
  for(;;) {
    // Get a mini-batch from current data matrix
    DMatrix mini_batch;
    mini_batch.ReAlloc(batch_size_);
    index_t len = matrix->GetMiniBatch(batch_size_, mini_batch);
    if (len == 0) {
      break;
    }
    mini_batch.row_length = len;
    // Compress the sparse data matrix and sparse model
    // parameter to dense format
    std::vector<index_t> feature_list;
    mini_batch.Compress(feature_list);
    /*
    // Pull the model parameter from parameter server
    store->pull(feature_list, model);

    // Calculate gradient
    this->CalcGrad(matrix, model, grad);

    // Push gradient to the parameter server
    ps->push(grad, feature_list);
    */
  }
}